

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O3

void luaE_shrinkCI(lua_State *L)

{
  CallInfo *pCVar1;
  CallInfo *block;
  CallInfo *pCVar2;
  
  pCVar1 = L->ci->next;
  if (pCVar1 != (CallInfo *)0x0) {
    block = pCVar1->next;
    while (block != (CallInfo *)0x0) {
      pCVar2 = block->next;
      pCVar1->next = pCVar2;
      L->nci = L->nci - 1;
      luaM_free_(L,block,0x40);
      if (pCVar2 == (CallInfo *)0x0) {
        return;
      }
      pCVar2->previous = pCVar1;
      pCVar1 = pCVar2;
      block = pCVar2->next;
    }
  }
  return;
}

Assistant:

void luaE_shrinkCI (lua_State *L) {
  CallInfo *ci = L->ci->next;  /* first free CallInfo */
  CallInfo *next;
  if (ci == NULL)
    return;  /* no extra elements */
  while ((next = ci->next) != NULL) {  /* two extra elements? */
    CallInfo *next2 = next->next;  /* next's next */
    ci->next = next2;  /* remove next from the list */
    L->nci--;
    luaM_free(L, next);  /* free next */
    if (next2 == NULL)
      break;  /* no more elements */
    else {
      next2->previous = ci;
      ci = next2;  /* continue */
    }
  }
}